

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O1

int main(int argc,char **argv)

{
  rnnvalue *prVar1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  rnndb *db;
  rnndeccontext *ctx;
  ulonglong addr;
  ulonglong value;
  rnnenum *prVar5;
  rnndomain *domain;
  rnndecaddrinfo *prVar6;
  rnnbitset *prVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  char **ppcVar11;
  bool bVar12;
  char *variant;
  char local_5d;
  char *local_58;
  char *local_48;
  char **local_40;
  long local_38;
  
  local_48 = (char *)0x0;
  rnn_init();
  if (argc < 2) {
switchD_001024be_default:
    puts(
        "Usage:\n\tlookup [-f file.xml] [-a NVXX] -e enum-name [-- -v attribute value] value\n\tlookup [-f file.xml] [-a NVXX] -b bitset-name [-- -v attribute value] value\n\tlookup [-f file.xml] [-a NVXX] [-d domain-name] [-- -v attribute value] address\n\tlookup [-f file.xml] [-a NVXX] [-d domain-name] [-- -v attribute value] address value"
        );
    exit(2);
  }
  bVar12 = false;
  db = rnn_newdb();
  iVar3 = getopt(argc,argv,"f:a:d:e:b:c");
  iVar3 = iVar3 << 0x18;
  local_40 = argv;
  if (iVar3 == -0x1000000) {
    local_58 = "nv_mmio.xml";
    pcVar8 = "NV_MMIO";
    local_5d = 'd';
  }
  else {
    local_38 = 1;
    local_5d = 'd';
    pcVar8 = "NV_MMIO";
    local_58 = "nv_mmio.xml";
    do {
      pcVar10 = _optarg;
      switch(iVar3 >> 0x18) {
      case 0x61:
        iVar3 = strncasecmp(_optarg,"NV",2);
        if (iVar3 == 0) {
          local_48 = strdup(pcVar10);
        }
        else {
          asprintf(&local_48,"NV%s",pcVar10);
        }
        break;
      case 0x62:
        pcVar8 = strdup(_optarg);
        local_5d = 'b';
        break;
      case 99:
        local_38 = 0;
        break;
      case 100:
        pcVar8 = strdup(_optarg);
        local_5d = 'd';
        break;
      case 0x65:
        pcVar8 = strdup(_optarg);
        local_5d = 'e';
        break;
      case 0x66:
        local_58 = strdup(_optarg);
        break;
      default:
        goto switchD_001024be_default;
      }
      iVar3 = getopt(argc,argv,"f:a:d:e:b:c");
      iVar3 = iVar3 << 0x18;
    } while (iVar3 != -0x1000000);
    bVar12 = local_38 == 0;
  }
  rnn_parsefile(db,local_58);
  rnn_prepdb(db);
  ctx = rnndec_newcontext(db);
  if (!bVar12) {
    ctx->colors = &rnndec_colorsterm;
  }
  if (local_48 != (char *)0x0) {
    rnndec_varadd(ctx,"chipset",local_48);
  }
  ppcVar2 = local_40;
  iVar3 = _optind;
  lVar9 = (long)_optind;
  pcVar10 = local_40[lVar9];
  iVar4 = strcmp(pcVar10,"-v");
  if (iVar4 == 0) {
    ppcVar11 = ppcVar2 + lVar9;
    do {
      rnndec_varadd(ctx,ppcVar11[1],ppcVar11[2]);
      iVar3 = _optind + 3;
      ppcVar11 = ppcVar2 + (long)_optind + 3;
      pcVar10 = *ppcVar11;
      _optind = iVar3;
      iVar4 = strcmp(pcVar10,"-v");
    } while (iVar4 == 0);
  }
  if (argc <= iVar3) {
    main_cold_1();
    return 1;
  }
  value = 0;
  addr = strtoull(pcVar10,(char **)0x0,0x10);
  if (_optind + 1 < argc) {
    value = strtoull(local_40[(long)_optind + 1],(char **)0x0,0x10);
  }
  if (local_5d == 'b') {
    prVar7 = rnn_findbitset(db,pcVar8);
    if (prVar7 != (rnnbitset *)0x0) {
      pcVar8 = "TODO";
LAB_00102776:
      puts(pcVar8);
      return 0;
    }
    pcVar10 = "Not a bitset: \'%s\'\n";
  }
  else if (local_5d == 'd') {
    domain = rnn_finddomain(db,pcVar8);
    if (domain != (rnndomain *)0x0) {
      prVar6 = rnndec_decodeaddr(ctx,domain,addr,0);
      if (prVar6 == (rnndecaddrinfo *)0x0) {
        return 1;
      }
      pcVar8 = prVar6->name;
      if (prVar6->typeinfo != (rnntypeinfo *)0x0) {
        pcVar10 = rnndec_decodeval(ctx,prVar6->typeinfo,value,prVar6->width);
        printf("%s => %s\n",pcVar8,pcVar10);
        return 0;
      }
      goto LAB_00102776;
    }
    pcVar10 = "Not a domain: \'%s\'\n";
  }
  else {
    if (local_5d != 'e') {
      return 1;
    }
    prVar5 = rnn_findenum(db,pcVar8);
    if (prVar5 != (rnnenum *)0x0) {
      if (0 < (long)prVar5->valsnum) {
        lVar9 = 0;
        do {
          prVar1 = prVar5->vals[lVar9];
          if ((prVar1->valvalid != 0) && (prVar1->value == addr)) {
            pcVar8 = prVar1->name;
            goto LAB_00102776;
          }
          lVar9 = lVar9 + 1;
        } while (prVar5->valsnum != lVar9);
      }
      printf("%#lx\n",addr);
      return 0;
    }
    pcVar10 = "Not an enum: \'%s\'\n";
  }
  fprintf(_stderr,pcVar10,pcVar8);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	char *file = "nv_mmio.xml";
	char *name = "NV_MMIO";
	char *variant = NULL;
	char c, mode = 'd';
	uint64_t reg, colors=1, val = 0;
	struct rnndeccontext *vc;

	rnn_init();
	if (argc < 2) {
		usage();
	}
	struct rnndb *db = rnn_newdb();

	/* Arguments parsing */
	while ((c = getopt (argc, argv, "f:a:d:e:b:c")) != -1) {
		switch (c) {
			case 'f':
				file = strdup(optarg);
				break;
			case 'e':
				mode = 'e';
				name = strdup(optarg);
				break;
			case 'b':
				mode = 'b';
				name = strdup(optarg);
				break;
			case 'd':
				mode = 'd';
				name = strdup(optarg);
				break;
			case 'a':
				if (!strncasecmp(optarg, "NV", 2))
					variant = strdup(optarg);
				else
					asprintf(&variant, "NV%s", optarg);
				break;
			case 'c':
				colors = 0;
				break;
			default: usage();
		}
	}

	rnn_parsefile (db, file);
	rnn_prepdb (db);
	vc = rnndec_newcontext(db);
	if(colors)
		vc->colors = &rnndec_colorsterm;

	if (variant)
		rnndec_varadd(vc, "chipset", variant);

	/* Parse extra arguments */
	while (!strcmp (argv[optind], "-v")) {
		rnndec_varadd(vc, argv[optind+1], argv[optind+2]);
		optind+=3;
	}

	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}

	reg = strtoull(argv[optind], 0, 16);
	if (optind + 1 < argc)
		val = strtoull(argv[optind + 1], 0, 16);

	if (mode == 'e') {
		struct rnnenum *en = rnn_findenum (db, name);
		if (en) {
			int i;
			int dec = 0;
			for (i = 0; i < en->valsnum; i++)
				if (en->vals[i]->valvalid && en->vals[i]->value == reg) {
					printf ("%s\n", en->vals[i]->name);
					dec = 1;
					break;
				}
			if (!dec)
				printf ("%#"PRIx64"\n", reg);

			return 0;
		} else {
			fprintf(stderr, "Not an enum: '%s'\n", name);
			return 1;
		}
	} else if (mode == 'b') {
		struct rnnbitset *bs = rnn_findbitset (db, name);

		if (bs) {
			printf("TODO\n");
			return 0;
		} else {
			fprintf(stderr, "Not a bitset: '%s'\n", name);
			return 1;
		}

	} else if (mode == 'd') {
		struct rnndomain *dom = rnn_finddomain (db, name);

		if (dom) {
			struct rnndecaddrinfo *info = rnndec_decodeaddr(vc, dom, reg, 0);
			if (info && info->typeinfo)
				printf ("%s => %s\n", info->name, rnndec_decodeval(vc, info->typeinfo, val, info->width));
			else if (info)
				printf ("%s\n", info->name);
			else
				return 1;
			return 0;
		} else {
			fprintf(stderr, "Not a domain: '%s'\n", name);
			return 1;
		}
	} else {
		return 1;
	}
}